

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppGeneratorTest_CtypeOnExtensionTest_Test::
CppGeneratorTest_CtypeOnExtensionTest_Test(CppGeneratorTest_CtypeOnExtensionTest_Test *this)

{
  CppGeneratorTest_CtypeOnExtensionTest_Test *this_local;
  
  CppGeneratorTest::CppGeneratorTest(&this->super_CppGeneratorTest);
  (this->super_CppGeneratorTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CppGeneratorTest_CtypeOnExtensionTest_Test_02a01cb8;
  return;
}

Assistant:

TEST_F(CppGeneratorTest, CtypeOnExtensionTest) {
  CreateTempFile("foo.proto",
                 R"schema(
    edition = "2023";
    message Foo {
      extensions 1 to max;
    }
    extend Foo {
      bytes bar = 1 [ctype=CORD];
    })schema");
  RunProtoc(
      "protocol_compiler --proto_path=$tmpdir --cpp_out=$tmpdir foo.proto");
  ExpectErrorSubstring(
      "Extension bar specifies CORD string type which is not supported for "
      "extensions");
}